

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventDispatcher.cpp
# Opt level: O0

int __thiscall
EventDispatcherHelper::removeEventListener
          (EventDispatcherHelper *this,IEventListener *listener,int event_id)

{
  EventListenerNode *pEVar1;
  bool bVar2;
  EventListenerNode **ppEVar3;
  EventListenerNode *lnode;
  list<EventDispatcherHelper::EventListenerNode_*> local_60;
  undefined1 local_48 [8];
  iterator i;
  AutoLock _auto_lock_;
  int event_id_local;
  IEventListener *listener_local;
  EventDispatcherHelper *this_local;
  
  AutoLock::AutoLock((AutoLock *)&i,&this->mLock,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/EventDispatcher.cpp"
                     ,0x74);
  JetHead::list<EventDispatcherHelper::EventListenerNode_*>::begin
            ((list<EventDispatcherHelper::EventListenerNode_*> *)local_48);
  do {
    JetHead::list<EventDispatcherHelper::EventListenerNode_*>::end(&local_60);
    bVar2 = JetHead::list<EventDispatcherHelper::EventListenerNode_*>::iterator::operator!=
                      ((iterator *)local_48,(iterator *)&local_60);
    JetHead::list<EventDispatcherHelper::EventListenerNode_*>::iterator::~iterator
              ((iterator *)&local_60);
    if (!bVar2) {
      lnode._4_4_ = 2;
LAB_0011f942:
      JetHead::list<EventDispatcherHelper::EventListenerNode_*>::iterator::~iterator
                ((iterator *)local_48);
      if (lnode._4_4_ == 2) {
        this_local._4_4_ = -1;
      }
      AutoLock::~AutoLock((AutoLock *)&i);
      return this_local._4_4_;
    }
    ppEVar3 = JetHead::list<EventDispatcherHelper::EventListenerNode_*>::iterator::operator*
                        ((iterator *)local_48);
    pEVar1 = *ppEVar3;
    if ((pEVar1->mEventId == event_id) && (pEVar1->mListener == listener)) {
      pEVar1->mListener = (IEventListener *)0x0;
      this_local._4_4_ = 0;
      lnode._4_4_ = 1;
      goto LAB_0011f942;
    }
    JetHead::list<EventDispatcherHelper::EventListenerNode_*>::iterator::operator++
              ((iterator *)local_48);
  } while( true );
}

Assistant:

int EventDispatcherHelper::removeEventListener( IEventListener *listener, int event_id )
{
	DebugAutoLock( mLock );

	for (JetHead::list<EventListenerNode*>::iterator i = mEventList.begin();
		 i != mEventList.end(); ++i)
	{
		EventListenerNode *lnode = *i;
		
		if ( lnode->mEventId == event_id && lnode->mListener == listener )
		{
			// Update mListener 
			lnode->mListener = NULL;
			return 0;
		}
	}

	// Didn't find it
	return -1;
}